

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

bool test_SSTableData_merge(void)

{
  __type _Var1;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_00;
  vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *this_01;
  long lVar2;
  pointer pSVar3;
  pointer pSVar4;
  bool bVar5;
  initializer_list<SSTableDataEntry> __l;
  initializer_list<SSTableDataEntry> __l_00;
  initializer_list<SSTableDataEntry> __l_01;
  initializer_list<SSTableDataEntry> __l_02;
  allocator_type local_361;
  SSTableData merged_data;
  SSTableData baseline;
  SSTableDataEntry local_330;
  SSTableDataEntry local_2f0;
  SSTableDataEntry local_2b0;
  SSTableDataEntry local_270;
  SSTableDataEntry local_230;
  SSTableDataEntry local_1f0;
  SSTableDataEntry local_1b0;
  SSTableDataEntry local_170;
  SSTableDataEntry local_130;
  SSTableDataEntry local_f0;
  SSTableDataEntry local_b0;
  SSTableDataEntry local_70;
  
  this = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,false,0x4840e3f3,3,"asdasd");
  SSTableDataEntry::SSTableDataEntry(&local_270,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0x497ff7f0,10,"Hello,NIMO");
  __l._M_len = 5;
  __l._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (this,__l,(allocator_type *)&merged_data);
  lVar2 = 0x120;
  do {
    std::__cxx11::string::~string((string *)(&local_330.delete_flag + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x20);
  this_00 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0x75bc703,2,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,true,0x4840e3f4,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_270,false,0x12d0e3,4,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0xbc28e1,0xf,"Hello,NIMO2");
  __l_00._M_len = 5;
  __l_00._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (this_00,__l_00,(allocator_type *)&merged_data);
  lVar2 = 0x120;
  do {
    std::__cxx11::string::~string((string *)(&local_330.delete_flag + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x20);
  this_01 = (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)operator_new(0x18);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,0x14,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0x75bc703,0x16,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,true,0x4840e3f4,0x17,"");
  SSTableDataEntry::SSTableDataEntry(&local_270,false,0x12d0e3,0x18,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0xbc28e1,0x19,"Hello,NIMO2");
  __l_01._M_len = 5;
  __l_01._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (this_01,__l_01,(allocator_type *)&merged_data);
  lVar2 = 0x120;
  do {
    std::__cxx11::string::~string((string *)(&local_330.delete_flag + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x20);
  merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
            (&merged_data,this,this_00,this_01);
  SSTableDataEntry::SSTableDataEntry(&local_330,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2f0,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2b0,false,0x75bc703,2,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_270,true,0x4840e3f4,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_230,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_1f0,false,0x497ff7f0,10,"Hello,NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_1b0,false,0xbc28e1,0xf,"Hello,NIMO2");
  SSTableDataEntry::SSTableDataEntry(&local_170,false,0xbc614e,0x14,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_130,false,0x75bc703,0x16,"LLLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_f0,true,0x4840e3f4,0x17,"");
  SSTableDataEntry::SSTableDataEntry(&local_b0,false,0x12d0e3,0x18,"NIMO!");
  SSTableDataEntry::SSTableDataEntry(&local_70,false,0xbc28e1,0x19,"Hello,NIMO2");
  __l_02._M_len = 0xc;
  __l_02._M_array = &local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            (&baseline,__l_02,&local_361);
  lVar2 = 0x2e0;
  do {
    std::__cxx11::string::~string((string *)(&local_330.delete_flag + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x20);
  pSVar3 = merged_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar4 = baseline.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)merged_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)merged_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
            _M_impl.super__Vector_impl_data._M_start ==
      (long)baseline.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)baseline.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
            .super__Vector_impl_data._M_start) {
    for (; (((bVar5 = pSVar3 == merged_data.
                                super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish, !bVar5 &&
             (pSVar3->delete_flag == pSVar4->delete_flag)) &&
            (pSVar3->timestamp == pSVar4->timestamp)) &&
           (pSVar3->value_length == pSVar4->value_length)); pSVar3 = pSVar3 + 1) {
      _Var1 = std::operator==(&pSVar3->value,&pSVar4->value);
      if (!_Var1) break;
      pSVar4 = pSVar4 + 1;
    }
  }
  else {
    bVar5 = false;
  }
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&baseline);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&merged_data);
  return bVar5;
}

Assistant:

bool test_SSTableData_merge() {
    auto *data1 = new SSTableData{
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {false, 1212212211, 3,  "asdasd"},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"}
    };
    auto *data2 = new SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 123455235,  2,  "LLLLLL"},
            {true,  1212212212, 3,  ""},
            {false, 1233123,    4,  "NIMO!"},
            {false, 12331233,   15, "Hello,NIMO2"}
    };
    auto *data3 = new SSTableData{
            {false, 12345678,   20, "Hello,World!"},
            {false, 123455235,  22, "LLLLLL"},
            {true,  1212212212, 23, ""},
            {false, 1233123,    24, "NIMO!"},
            {false, 12331233,   25, "Hello,NIMO2"}
    };
    auto merged_data = SSTableData{merge(data1, data2, data3)};
    auto baseline = SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455235,  2,  "LLLLLL"},
            {true,  1212212212, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"},
            {false, 12331233,   15, "Hello,NIMO2"},
            {false, 12345678,   20, "Hello,World!"},
            {false, 123455235,  22, "LLLLLL"},
            {true,  1212212212, 23, ""},
            {false, 1233123,    24, "NIMO!"},
            {false, 12331233,   25, "Hello,NIMO2"}
    };
    return std::equal(merged_data.begin(), merged_data.end(), baseline.begin(), baseline.end(),
                      [](const SSTableDataEntry &e1, const SSTableDataEntry &e2) {
                          return e1.delete_flag == e2.delete_flag && e1.timestamp == e2.timestamp &&
                                 e1.value_length == e2.value_length && e1.value_length == e2.value_length &&
                                 e1.value == e2.value;
                      });
}